

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O1

uint32_t FAudioVoice_EnableEffect(FAudioVoice *voice,uint32_t EffectIndex,uint32_t OperationSet)

{
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    FAudio_PlatformLockMutex(voice->effectLock);
    (voice->effects).desc[EffectIndex].InitialState = 1;
    FAudio_PlatformUnlockMutex(voice->effectLock);
  }
  else {
    FAudio_OPERATIONSET_QueueEnableEffect(voice,EffectIndex,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_EnableEffect(
	FAudioVoice *voice,
	uint32_t EffectIndex,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueEnableEffect(
			voice,
			EffectIndex,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->effectLock);
	LOG_MUTEX_LOCK(voice->audio, voice->effectLock)
	voice->effects.desc[EffectIndex].InitialState = 1;
	FAudio_PlatformUnlockMutex(voice->effectLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->effectLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}